

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O2

aom_metadata_t *
aom_img_metadata_alloc
          (uint32_t type,uint8_t *data,size_t sz,aom_metadata_insert_flags_t insert_flag)

{
  aom_metadata_t *__ptr;
  uint8_t *__dest;
  
  if ((sz != 0 && data != (uint8_t *)0x0) &&
     (__ptr = (aom_metadata_t *)malloc(0x20), __ptr != (aom_metadata_t *)0x0)) {
    __ptr->type = type;
    __dest = (uint8_t *)malloc(sz);
    __ptr->payload = __dest;
    if (__dest != (uint8_t *)0x0) {
      memcpy(__dest,data,sz);
      __ptr->sz = sz;
      __ptr->insert_flag = insert_flag;
      return __ptr;
    }
    free(__ptr);
  }
  return (aom_metadata_t *)0x0;
}

Assistant:

aom_metadata_t *aom_img_metadata_alloc(
    uint32_t type, const uint8_t *data, size_t sz,
    aom_metadata_insert_flags_t insert_flag) {
  if (!data || sz == 0) return NULL;
  aom_metadata_t *metadata = (aom_metadata_t *)malloc(sizeof(aom_metadata_t));
  if (!metadata) return NULL;
  metadata->type = type;
  metadata->payload = (uint8_t *)malloc(sz);
  if (!metadata->payload) {
    free(metadata);
    return NULL;
  }
  memcpy(metadata->payload, data, sz);
  metadata->sz = sz;
  metadata->insert_flag = insert_flag;
  return metadata;
}